

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

bool __thiscall
Memory::HeapBlockMap32::
RescanHeapBlock<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
          (HeapBlockMap32 *this,void *dirtyPage,HeapBlockType blockType,L2MapChunk *chunk,uint id2,
          bool *anyObjectsMarkedOnPage,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  HeapBlockType HVar3;
  uint bucketIndex_00;
  uint localObjectSize;
  undefined4 *puVar4;
  char *blockStartAddress;
  BVStatic<256UL> *this_00;
  SmallFinalizableHeapBlock *block_00;
  uint bucketIndex;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *block;
  BVStatic<256UL> *markBits;
  char *heapBlockPageAddress;
  bool *anyObjectsMarkedOnPage_local;
  uint id2_local;
  L2MapChunk *chunk_local;
  HeapBlockType blockType_local;
  void *dirtyPage_local;
  HeapBlockMap32 *this_local;
  
  if (chunk == (L2MapChunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x2c8,"(chunk != nullptr)","chunk != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  blockStartAddress =
       SmallHeapBlockT<SmallAllocationBlockAttributes>::GetBlockStartAddress((char *)dirtyPage);
  this_00 = L2MapChunk::GetMarkBitVectorForPages<256ul>(chunk,blockStartAddress);
  bVar2 = BVStatic<256UL>::IsAllClear(this_00);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    HVar3 = HeapBlock::GetHeapBlockType(chunk->map[id2]);
    if (HVar3 != blockType) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                         ,0x2d2,"(chunk->map[id2]->GetHeapBlockType() == blockType)",
                         "chunk->map[id2]->GetHeapBlockType() == blockType");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    block_00 = GetHeapBlockForRescan<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                         (this,chunk,id2);
    bucketIndex_00 = (uint)chunk->blockInfo[id2].bucketIndex;
    localObjectSize =
         HeapInfo::GetObjectSizeForBucketIndex<SmallAllocationBlockAttributes>(bucketIndex_00);
    bVar2 = SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
            ::RescanObjectsOnPage
                      (block_00,(char *)dirtyPage,blockStartAddress,this_00,localObjectSize,
                       bucketIndex_00,anyObjectsMarkedOnPage,recycler);
    if (bVar2) {
      this_local._7_1_ = true;
    }
    else {
      HeapBlock::SetNeedOOMRescan(chunk->map[id2],recycler);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
HeapBlockMap32::RescanHeapBlock(void * dirtyPage, HeapBlock::HeapBlockType blockType, L2MapChunk* chunk, uint id2, bool* anyObjectsMarkedOnPage, Recycler * recycler)
{
    Assert(chunk != nullptr);
    char* heapBlockPageAddress = TBlockType::GetBlockStartAddress((char*) dirtyPage);

    typedef typename TBlockType::HeapBlockAttributes TBlockAttributes;

    // We need to check the entire mark bit vector here. It's not sufficient to just check the page's
    // mark bit vector because the object that's dirty on the page could have started on an earlier page
    auto markBits = chunk->GetMarkBitVectorForPages<TBlockAttributes::BitVectorCount>(heapBlockPageAddress);
    if (!markBits->IsAllClear())
    {
        Assert(chunk->map[id2]->GetHeapBlockType() == blockType);

        // Small finalizable heap blocks require the HeapBlock * (to look up object attributes).
        // For others, this is null
        TBlockType* block = GetHeapBlockForRescan<TBlockType>(chunk, id2);
        uint bucketIndex = chunk->blockInfo[id2].bucketIndex;
        if (!SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(block,
            (char *)dirtyPage, heapBlockPageAddress, markBits, HeapInfo::GetObjectSizeForBucketIndex<TBlockAttributes>(bucketIndex), bucketIndex, anyObjectsMarkedOnPage, recycler))
        {
            // Failed due to OOM
            ((TBlockType*) chunk->map[id2])->SetNeedOOMRescan(recycler);
            return false;
        }

        return true;
    }

    // Didn't actually rescan the block.
    return false;
}